

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallNormalHeapBucket.cpp
# Opt level: O2

bool Memory::
     SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
     ::RescanObjectsOnPage
               (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *block,char *pageAddress
               ,char *blockStartAddress,BVStatic<2048UL> *heapBlockMarkBits,uint localObjectSize,
               uint bucketIndex,bool *anyObjectRescanned,Recycler *recycler)

{
  MarkData *pMVar1;
  ushort uVar2;
  code *pcVar3;
  size_t sVar4;
  bool bVar5;
  BOOLEAN BVar6;
  bool bVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 *puVar11;
  BlockInfo *pBVar12;
  SmallHeapBlockBitVector *this;
  char *error;
  uint uVar13;
  BVIndex i;
  ulong uVar14;
  char *pcVar15;
  uint bitIndex;
  uint pageStartBitIndex;
  uint i_00;
  uint objectIndex;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint local_38;
  
  pMVar1 = &(recycler->collectionStats).markData;
  pMVar1->rescanPageCount = pMVar1->rescanPageCount + 8;
  bVar5 = BVStatic<2048UL>::IsAllClear(heapBlockMarkBits);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,100,"(!heapBlockMarkBits->IsAllClear())","!heapBlockMarkBits->IsAllClear()")
    ;
    if (!bVar5) goto LAB_006b6102;
    *puVar11 = 0;
  }
  if (anyObjectRescanned != (bool *)0x0) {
    *anyObjectRescanned = false;
  }
  uVar14 = (long)pageAddress - (long)blockStartAddress;
  if (0x7fff < uVar14) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x6b,
                       "((char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize)"
                       ,
                       "(char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize"
                      );
    if (!bVar5) goto LAB_006b6102;
    *puVar11 = 0;
  }
  uVar17 = (uVar14 & 0xffffffff) / (ulong)localObjectSize;
  pcVar15 = blockStartAddress + (uint)uVar17 * localObjectSize;
  uVar8 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAddressBitIndex(pcVar15);
  if (0xfffefff < (uint)uVar14) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                       ,0x77,"(pageByteOffset / AutoSystemInfo::PageSize < (32767 * 2 + 1))",
                       "pageByteOffset / AutoSystemInfo::PageSize < USHRT_MAX");
    if (!bVar5) goto LAB_006b6102;
    *puVar11 = 0;
  }
  pageStartBitIndex = (uint)(uVar14 >> 4) & 0xfffffff;
  pBVar12 = HeapInfo::GetBlockInfo<MediumAllocationBlockAttributes>(localObjectSize);
  uVar13 = (uint)uVar14 >> 0xc & 0xffff;
  local_38 = SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::CalculateMarkCountForPage
                       (heapBlockMarkBits,bucketIndex,pageStartBitIndex);
  uVar2 = pBVar12[uVar13].pageObjectCount;
  uVar16 = (uint)(0x8000 / (ulong)localObjectSize);
  if (uVar16 <= (uint)uVar17) {
    ReportFatalException(0,-0x7fffbffb,Fatal_Recycler_MemoryCorruption,3);
  }
  bVar5 = SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::CanRescanFullBlock();
  if ((bVar5) && (local_38 == uVar2)) {
    bVar5 = Recycler::AddMark(recycler,pageAddress,0x1000);
    if (bVar5) {
      sVar4 = (recycler->collectionStats).markData.rescanObjectByteCount;
      (recycler->collectionStats).markData.rescanObjectCount =
           (ulong)(uint)uVar2 + (recycler->collectionStats).markData.rescanObjectCount;
      (recycler->collectionStats).markData.rescanObjectByteCount =
           local_38 * localObjectSize + sVar4;
      bVar5 = true;
      if (anyObjectRescanned != (bool *)0x0) {
LAB_006b60f9:
        *anyObjectRescanned = bVar5;
LAB_006b60fb:
        bVar5 = true;
      }
    }
    else {
LAB_006b5fcb:
      bVar5 = false;
    }
    return bVar5;
  }
  i_00 = (uint)uVar8;
  if (pcVar15 == pageAddress) {
    bVar5 = true;
  }
  else {
    if (pcVar15 < blockStartAddress || pageAddress <= pcVar15) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0x9f,
                         "(startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress)"
                         ,
                         "startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress"
                        );
      if (!bVar5) goto LAB_006b6102;
      *puVar11 = 0;
    }
    BVar6 = BVStatic<2048UL>::Test(heapBlockMarkBits,i_00);
    bVar5 = BVar6 != '\x01';
    local_38 = local_38 + (BVar6 == '\x01');
  }
  uVar9 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetObjectBitDeltaForBucketIndex
                    (bucketIndex);
  uVar18 = 0;
  puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while (uVar18 < local_38) {
    objectIndex = (uint)uVar17;
    if (uVar16 <= objectIndex) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0xae,"(objectIndex < localObjectCount)","objectIndex < localObjectCount");
      if (!bVar7) goto LAB_006b6102;
      *puVar11 = 0;
    }
    this = HeapInfo::GetInvalidBitVectorForBucket<MediumAllocationBlockAttributes>(bucketIndex);
    BVar6 = BVStatic<2048UL>::Test(this,i_00);
    if (BVar6 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                         ,0xaf,
                         "(!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex))"
                         ,
                         "!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex)"
                        );
      if (!bVar7) goto LAB_006b6102;
      *puVar11 = 0;
    }
    BVar6 = BVStatic<2048UL>::Test(heapBlockMarkBits,i_00);
    if (BVar6 != '\0') {
      bVar7 = SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>::RescanObject
                        (block,blockStartAddress + objectIndex * localObjectSize,localObjectSize,
                         objectIndex,recycler);
      if (!bVar7) goto LAB_006b5fcb;
      uVar18 = uVar18 + 1;
    }
    uVar17 = (ulong)(objectIndex + 1);
    i_00 = i_00 + uVar9;
  }
  uVar10 = SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::CalculateMarkCountForPage
                     (heapBlockMarkBits,bucketIndex,pageStartBitIndex);
  if (pcVar15 == pageAddress || bVar5) {
    if (local_38 == uVar10) goto LAB_006b608b;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar11 = 1;
    error = 
    "(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex))"
    ;
    pcVar15 = 
    "rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex)"
    ;
    uVar10 = 0xc5;
  }
  else {
    if (local_38 == uVar10 + 1) goto LAB_006b608b;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar11 = 1;
    error = 
    "(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1)"
    ;
    pcVar15 = 
    "rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1"
    ;
    uVar10 = 0xc1;
  }
  while (bVar5 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallNormalHeapBucket.cpp"
                            ,uVar10,error,pcVar15), bVar5) {
    *puVar11 = 0;
LAB_006b608b:
    i = ((int)uVar17 + 1) * uVar9;
    do {
      uVar16 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar16;
      if (pBVar12[uVar13].lastObjectIndexOnPage <= uVar16) {
        if (anyObjectRescanned == (bool *)0x0) goto LAB_006b60fb;
        bVar5 = uVar18 != 0;
        goto LAB_006b60f9;
      }
      BVar6 = BVStatic<2048UL>::Test(heapBlockMarkBits,i);
      i = i + uVar9;
    } while (BVar6 == '\0');
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar11 = 1;
    error = "(!heapBlockMarkBits->Test(i * objectBitDelta))";
    pcVar15 = "!heapBlockMarkBits->Test(i * objectBitDelta)";
    uVar10 = 0xcd;
  }
LAB_006b6102:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

bool
SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(TBlockType * block, char* pageAddress, char * blockStartAddress, BVStatic<TBlockAttributes::BitVectorCount> * heapBlockMarkBits, const uint localObjectSize, uint bucketIndex, __out_opt bool* anyObjectRescanned, Recycler * recycler)
{
    RECYCLER_STATS_ADD(recycler, markData.rescanPageCount, TBlockAttributes::PageCount);

    // By the time we get here, we should have ensured that there's a mark on any page somewhere.
    // REVIEW: Worth check on just the page's mark bits?
    Assert(!heapBlockMarkBits->IsAllClear());

    if (anyObjectRescanned != nullptr)
    {
        *anyObjectRescanned = false;
    }

    Assert((char*)pageAddress - blockStartAddress < TBlockAttributes::PageCount * AutoSystemInfo::PageSize);
    const uint pageByteOffset = static_cast<uint>((char*)pageAddress - blockStartAddress);
    uint firstObjectOnPageIndex = pageByteOffset / localObjectSize;

    // This is not necessarily the address on the first object that starts on the page
    // If the last object on the previous page spans two pages, this is the address of that object
    // We do it this way so that we can figure out if we need to rescan the first few bytes of the page
    // if the actual first object on this page is not located at the start of the page
    char* const startObjectAddress = blockStartAddress + (firstObjectOnPageIndex * localObjectSize);
    const uint startBitIndex = TBlockType::GetAddressBitIndex(startObjectAddress);
    const uint pageStartBitIndex = pageByteOffset >> HeapConstants::ObjectAllocationShift;

    Assert(pageByteOffset / AutoSystemInfo::PageSize < USHRT_MAX);
    const ushort pageNumber = static_cast<const ushort>(pageByteOffset / AutoSystemInfo::PageSize);
    const typename TBlockType::BlockInfo& blockInfoForPage = HeapInfo::GetBlockInfo<TBlockAttributes>(localObjectSize)[pageNumber];

    bool lastObjectOnPreviousPageMarked = false;
    // Calculate the mark count here since we no longer keep track during marking
    uint rescanMarkCount = TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex);
    const uint pageObjectCount = blockInfoForPage.pageObjectCount;
    const uint localObjectCount = (TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / localObjectSize;

    // With protected unallocatable ending pages and reset writewatch, we should never be scanning on these pages.
    if (firstObjectOnPageIndex >= localObjectCount)
    {
        ReportFatalException(NULL, E_FAIL, Fatal_Recycler_MemoryCorruption, 3);
    }

    // If all objects are marked, rescan whole block at once
    if (TBlockType::CanRescanFullBlock() && rescanMarkCount == pageObjectCount)
    {
        // REVIEW: Can we optimize this more?
        if (!recycler->AddMark(pageAddress, AutoSystemInfo::PageSize))
        {
            // Failed to add to the mark stack due to OOM.
            return false;
        }

        RECYCLER_STATS_ADD(recycler, markData.rescanObjectCount, pageObjectCount);
        RECYCLER_STATS_ADD(recycler, markData.rescanObjectByteCount, localObjectSize * pageObjectCount);
        if (anyObjectRescanned != nullptr)
        {
            *anyObjectRescanned = true;
        }

        return true;
    }

    if (startObjectAddress != pageAddress)
    {
        // If the last object on the previous page that spans into the current page is marked,
        // we need to count that in the markCount for rescan
        Assert(startObjectAddress >= blockStartAddress && startObjectAddress < pageAddress);
        lastObjectOnPreviousPageMarked = (heapBlockMarkBits->Test(startBitIndex) == TRUE);
        if (lastObjectOnPreviousPageMarked)
        {
            rescanMarkCount++;
        }
    }

    const uint objectBitDelta = SmallHeapBlockT<TBlockAttributes>::GetObjectBitDeltaForBucketIndex(bucketIndex);

    uint rescanCount = 0;
    uint objectIndex = firstObjectOnPageIndex;

    for (uint bitIndex = startBitIndex; rescanCount < rescanMarkCount; objectIndex++, bitIndex += objectBitDelta)
    {
        Assert(objectIndex < localObjectCount);
        Assert(!HeapInfo::GetInvalidBitVectorForBucket<TBlockAttributes>(bucketIndex)->Test(bitIndex));

        if (heapBlockMarkBits->Test(bitIndex))
        {
            char * objectAddress = blockStartAddress + objectIndex * localObjectSize;
            if (!TBlockType::RescanObject(block, objectAddress, localObjectSize, objectIndex, recycler))
            {
                // Failed to add to the mark stack due to OOM.
                return false;
            }

            rescanCount++;
        }
    }

    // Mark bits should not have changed during the Rescan
    if (startObjectAddress != pageAddress && lastObjectOnPreviousPageMarked)
    {
        Assert(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex) + 1);
    }
    else
    {
        Assert(rescanMarkCount == TBlockType::CalculateMarkCountForPage(heapBlockMarkBits, bucketIndex, pageStartBitIndex));
    }

#if DBG
    // We stopped when we hit the rescanMarkCount.
    // Make sure no other objects were marked, otherwise our rescanMarkCount was wrong.
    for (uint i = objectIndex + 1; i < blockInfoForPage.lastObjectIndexOnPage; i++)
    {
        Assert(!heapBlockMarkBits->Test(i * objectBitDelta));
    }
#endif

    // Let the caller know if we rescanned anything on this page
    if (anyObjectRescanned != nullptr)
    {
        (*anyObjectRescanned) = (rescanCount > 0);
    }

    return true;
}